

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O3

int Sbl_ManComputeDelay(Sbl_Man_t *p,int iLut,Vec_Int_t *vFanins)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  if ((long)vFanins->nSize < 1) {
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar3 = vFanins->pArray[lVar2];
      if (((long)iVar3 < 0) || (p->vArrs->nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = p->vArrs->pArray[iVar3] + 1;
      if (iVar1 <= iVar3) {
        iVar1 = iVar3;
      }
      lVar2 = lVar2 + 1;
    } while (vFanins->nSize != lVar2);
  }
  return iVar1;
}

Assistant:

int Sbl_ManComputeDelay( Sbl_Man_t * p, int iLut, Vec_Int_t * vFanins )
{
    int k, iFan, Delay = 0;
    Vec_IntForEachEntry( vFanins, iFan, k )
        Delay = Abc_MaxInt( Delay, Vec_IntEntry(p->vArrs, iFan) + 1 );
    return Delay;
}